

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

ImGuiTableSettings * ImGui::TableSettingsFindByID(ImGuiID id)

{
  ImGuiContext *pIVar1;
  ImGuiTableSettings *local_28;
  ImGuiTableSettings *settings;
  ImGuiContext *g;
  ImGuiID id_local;
  
  pIVar1 = GImGui;
  local_28 = ImChunkStream<ImGuiTableSettings>::begin(&GImGui->SettingsTables);
  while( true ) {
    if (local_28 == (ImGuiTableSettings *)0x0) {
      return (ImGuiTableSettings *)0x0;
    }
    if (local_28->ID == id) break;
    local_28 = ImChunkStream<ImGuiTableSettings>::next_chunk(&pIVar1->SettingsTables,local_28);
  }
  return local_28;
}

Assistant:

ImGuiTableSettings* ImGui::TableSettingsFindByID(ImGuiID id)
{
    // FIXME-OPT: Might want to store a lookup map for this?
    ImGuiContext& g = *GImGui;
    for (ImGuiTableSettings* settings = g.SettingsTables.begin(); settings != NULL; settings = g.SettingsTables.next_chunk(settings))
        if (settings->ID == id)
            return settings;
    return NULL;
}